

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws.c
# Opt level: O0

void nn_aws_init(nn_aws *self,int src,nn_ep *ep,nn_fsm *owner)

{
  nn_usock *in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  nn_fsm_fn in_RDI;
  nn_fsm *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff0;
  
  nn_fsm_init(unaff_retaddr,in_RDI,(nn_fsm_fn)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
              (int)((ulong)in_RDX >> 0x20),in_RCX,
              (nn_fsm *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  *(undefined4 *)(in_RDI + 0x58) = 1;
  *(undefined8 *)(in_RDI + 0x60) = in_RDX;
  nn_usock_init(in_RCX,in_stack_ffffffffffffffdc,(nn_fsm *)0x1567af);
  *(undefined8 *)(in_RDI + 0x2c8) = 0;
  *(undefined4 *)(in_RDI + 0x2d0) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x2d8) = 0;
  nn_sws_init((nn_sws *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20),
              (nn_ep *)in_RCX,
              (nn_fsm *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  nn_fsm_event_init((nn_fsm_event *)0x15680f);
  nn_fsm_event_init((nn_fsm_event *)0x156820);
  nn_list_item_init((nn_list_item *)(in_RDI + 0x1b70));
  return;
}

Assistant:

void nn_aws_init (struct nn_aws *self, int src,
    struct nn_ep *ep, struct nn_fsm *owner)
{
    nn_fsm_init (&self->fsm, nn_aws_handler, nn_aws_shutdown,
        src, self, owner);
    self->state = NN_AWS_STATE_IDLE;
    self->ep = ep;
    nn_usock_init (&self->usock, NN_AWS_SRC_USOCK, &self->fsm);
    self->listener = NULL;
    self->listener_owner.src = -1;
    self->listener_owner.fsm = NULL;
    nn_sws_init (&self->sws, NN_AWS_SRC_SWS, ep, &self->fsm);
    nn_fsm_event_init (&self->accepted);
    nn_fsm_event_init (&self->done);
    nn_list_item_init (&self->item);
}